

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_serialize_field
          (t_cpp_generator *this,ostream *out,t_field *tfield,string *prefix,string *suffix)

{
  _Alloc_hider _Var1;
  int iVar2;
  t_struct *tstruct;
  long *plVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  t_base_type *this_00;
  undefined1 auVar8 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(tfield->type_);
  std::operator+(&local_b0,prefix,&tfield->name_);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(suffix->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar7 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar7) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar2 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar5,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",&local_d0);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar2 == '\0')
     ) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if (((char)iVar2 != '\0') ||
         (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct),
         _Var1._M_p = local_d0._M_dataplus._M_p, (char)iVar2 != '\0')) {
        poVar4 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"xfer += oprot->",0xf);
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
        if ((char)iVar2 == '\0') {
          iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
          if ((char)iVar2 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,"writeI32(static_cast<int32_t>(",0x1e);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"));",3);
          }
        }
        else {
          this_00 = (t_base_type *)
                    (ulong)*(uint *)&(tstruct->members_).
                                     super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
          switch(this_00) {
          case (t_base_type *)0x0:
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",
                           &local_d0);
            __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case (t_base_type *)0x1:
            iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
            if ((char)iVar2 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>(out,"writeString(",0xc);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(out,"writeBinary(",0xc);
            }
            break;
          case (t_base_type *)0x2:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeBool(",10);
            break;
          case (t_base_type *)0x3:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeByte(",10);
            break;
          case (t_base_type *)0x4:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeI16(",9);
            break;
          case (t_base_type *)0x5:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
            break;
          case (t_base_type *)0x6:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeI64(",9);
            break;
          case (t_base_type *)0x7:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeDouble(",0xc);
            break;
          default:
            auVar8 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_(&local_50,this_00,auVar8._8_4_);
            std::operator+(&local_b0,"compiler error: no C++ writer for base type ",&local_50);
            std::operator+(auVar8._0_8_,&local_b0,&local_d0);
            __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        goto LAB_001888ba;
      }
      type_name_abi_cxx11_(&local_b0,this,(t_type *)tstruct,false,false);
      printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s\' TYPE \'%s\'\n",_Var1._M_p,
             local_b0._M_dataplus._M_p);
      goto LAB_001888b0;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    generate_serialize_container(this,out,(t_type *)tstruct,&local_90);
    local_b0._M_dataplus._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_001888ba;
  }
  else {
    paVar7 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    generate_serialize_struct(this,out,tstruct,&local_70,tfield->reference_);
    local_b0._M_dataplus._M_p = local_70._M_dataplus._M_p;
LAB_001888b0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar7) goto LAB_001888ba;
  }
  operator_delete(local_b0._M_dataplus._M_p);
LAB_001888ba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_serialize_field(ostream& out,
                                               t_field* tfield,
                                               string prefix,
                                               string suffix) {
  t_type* type = get_true_type(tfield->get_type());

  string name = prefix + tfield->get_name() + suffix;

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name, is_reference(tfield));
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name);
  } else if (type->is_base_type() || type->is_enum()) {

    indent(out) << "xfer += oprot->";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "writeBinary(" << name << ");";
        } else {
          out << "writeString(" << name << ");";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ");";
        break;
      default:
        throw "compiler error: no C++ writer for base type " + t_base_type::t_base_name(tbase)
            + name;
      }
    } else if (type->is_enum()) {
      out << "writeI32(static_cast<int32_t>(" << name << "));";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s' TYPE '%s'\n",
           name.c_str(),
           type_name(type).c_str());
  }
}